

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O3

void __thiscall
test_vector_dense_scalar_division_assignment_Test::TestBody
          (test_vector_dense_scalar_division_assignment_Test *this)

{
  double lhs_value;
  double dVar1;
  double *element;
  double *pdVar2;
  pointer *__ptr;
  char *pcVar3;
  Vector_Dense<double,_2UL> static_vector;
  Vector_Dense<double,_0UL> dynamic_vector;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  AssertHelper local_58;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_40;
  undefined8 local_38;
  AssertHelper local_28;
  Vector_Dense<double,_0UL> local_20;
  
  local_68 = (undefined1  [8])local_48;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x4018000000000000;
  local_48 = (undefined1  [8])0x4008000000000000;
  local_38 = 0xc014000000000000;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_20,(initializer_list<double> *)local_68);
  for (pdVar2 = local_20.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar2 != local_20.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish; pdVar2 = pdVar2 + 1) {
    *pdVar2 = *pdVar2 / 3.0;
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_48,"dynamic_vector[0]","1.0",
             *local_20.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,1.0);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)pbStack_40;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_68 + 8))();
    }
  }
  if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_48 + 8),pbStack_40);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_48,"dynamic_vector[1]","2.0",
             local_20.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],2.0);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)pbStack_40;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_68 + 8))();
    }
  }
  if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_48 + 8),pbStack_40);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_48,"dynamic_vector[2]","-5.0 / 3.0",
             local_20.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],-1.6666666666666667);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)pbStack_40;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x56,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_68 + 8))();
    }
  }
  if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_48 + 8),pbStack_40);
  }
  local_68 = (undefined1  [8])&local_58;
  local_58.data_ = (AssertHelperData *)0x4008000000000000;
  uStack_50 = 0xc014000000000000;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_48,(initializer_list<double> *)local_68);
  lhs_value = (double)local_48 * 0.25;
  dVar1 = (double)pbStack_40 * 0.25;
  unique0x100001de = SUB84(dVar1,0);
  local_48 = (undefined1  [8])lhs_value;
  unique0x100001e2 = (int)((ulong)dVar1 >> 0x20);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_68,"static_vector[0]","3.0 / 4.0",lhs_value,0.75);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_68,"static_vector[1]","-5.0 / 4.0",(double)pbStack_40,-1.25);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  if (local_20.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (double *)0x0) {
    operator_delete(local_20.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(test_vector_dense, scalar_division_assignment) {
  Vector_Dense<Scalar, 0> dynamic_vector = {3.0, 6.0, -5.0};
  dynamic_vector /= 3.0;
  EXPECT_DOUBLE_EQ(dynamic_vector[0], 1.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[1], 2.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[2], -5.0 / 3.0);

  Vector_Dense<Scalar, 2> static_vector = {3.0, -5.0};
  static_vector /= 4.0;
  EXPECT_DOUBLE_EQ(static_vector[0], 3.0 / 4.0);
  EXPECT_DOUBLE_EQ(static_vector[1], -5.0 / 4.0);
}